

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OPC_TreeBuilders.cpp
# Opt level: O3

float __thiscall
Opcode::AABBTreeOfTrianglesBuilder::GetSplittingValue
          (AABBTreeOfTrianglesBuilder *this,udword *primitives,udword nb_prims,AABB *global_box,
          udword axis)

{
  udword uVar1;
  MeshInterface *pMVar2;
  IndexedTriangle *pIVar3;
  Point *pPVar4;
  ulong uVar5;
  ulong uVar6;
  float fVar7;
  
  if (((this->super_AABBTreeBuilder).mSettings.mRules & 0x20) != 0) {
    if (nb_prims == 0) {
      fVar7 = 0.0;
    }
    else {
      pMVar2 = this->mIMesh;
      pIVar3 = pMVar2->mTris;
      pPVar4 = pMVar2->mVerts;
      uVar1 = pMVar2->mVertexStride;
      fVar7 = 0.0;
      uVar5 = 0;
      do {
        uVar6 = (ulong)(primitives[uVar5] * pMVar2->mTriStride);
        fVar7 = fVar7 + *(float *)((long)&pPVar4->x +
                                  (ulong)(*(int *)((long)pIVar3->mVRef + uVar6) * uVar1) +
                                  (ulong)axis * 4) +
                *(float *)((long)&pPVar4->x +
                          (ulong)(*(int *)((long)pIVar3->mVRef + uVar6 + 4) * uVar1) +
                          (ulong)axis * 4) +
                *(float *)((long)&pPVar4->x +
                          (ulong)(*(int *)((long)pIVar3->mVRef + uVar6 + 8) * uVar1) +
                          (ulong)axis * 4);
        uVar5 = uVar5 + 1;
      } while (nb_prims != uVar5);
    }
    return fVar7 / (float)(nb_prims * 3);
  }
  return (&(global_box->mCenter).x)[axis];
}

Assistant:

float AABBTreeOfTrianglesBuilder::GetSplittingValue(const udword* primitives, udword nb_prims, const AABB& global_box, udword axis)	const
{
	if(mSettings.mRules&SPLIT_GEOM_CENTER)
	{
		// Loop through triangles
		float SplitValue = 0.0f;
		VertexPointers VP;
		for(udword i=0;i<nb_prims;i++)
		{
			// Get current triangle-vertices
			mIMesh->GetTriangle(VP, primitives[i]);
			// Update split value
			SplitValue += (*VP.Vertex[0])[axis];
			SplitValue += (*VP.Vertex[1])[axis];
			SplitValue += (*VP.Vertex[2])[axis];
		}
		return SplitValue / float(nb_prims*3);
	}
	else return AABBTreeBuilder::GetSplittingValue(primitives, nb_prims, global_box, axis);
}